

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigNode.c
# Opt level: O1

void Fraig_NodeSimulate(Fraig_Node_t *pNode,int iWordStart,int iWordStop,int fUseRand)

{
  uint uVar1;
  Fraig_Node_t *pFVar2;
  Fraig_Node_t *pFVar3;
  uint *puVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigNode.c"
                  ,0xe8,"void Fraig_NodeSimulate(Fraig_Node_t *, int, int, int)");
  }
  uVar9 = (ulong)(fUseRand == 0);
  pFVar2 = pNode->p1;
  if (((ulong)pFVar2 & 1) == 0) {
    uVar10 = *(uint *)&pFVar2->field_0x18;
  }
  else {
    uVar10 = ~*(uint *)(((ulong)pFVar2 & 0xfffffffffffffffe) + 0x18);
  }
  uVar10 = uVar10 & 1;
  pFVar3 = pNode->p2;
  if (((ulong)pFVar3 & 1) == 0) {
    uVar7 = *(uint *)&pFVar3->field_0x18;
  }
  else {
    uVar7 = ~*(uint *)(((ulong)pFVar3 & 0xfffffffffffffffe) + 0x18);
  }
  uVar7 = uVar7 & 1;
  puVar4 = (&pNode->puSimR)[uVar9];
  lVar5 = *(long *)(((ulong)pFVar2 & 0xfffffffffffffffe) + 0x68 + uVar9 * 8);
  lVar6 = *(long *)(((ulong)pNode->p2 & 0xfffffffffffffffe) + 0x68 + uVar9 * 8);
  uVar1 = *(uint *)&pNode->field_0x18;
  if ((uVar10 == 0) || (uVar7 == 0)) {
    if ((uVar10 == 0) || (uVar7 != 0)) {
      if ((uVar10 == 0) && (uVar7 != 0)) {
        if ((uVar1 & 1) == 0) {
          if (iWordStart < iWordStop) {
            lVar8 = (long)iWordStart;
            uVar10 = 0;
            do {
              uVar7 = ~*(uint *)(lVar6 + lVar8 * 4) & *(uint *)(lVar5 + lVar8 * 4);
              puVar4[lVar8] = uVar7;
              uVar10 = uVar10 ^ uVar7 * s_FraigPrimes[lVar8];
              lVar8 = lVar8 + 1;
            } while (iWordStop != lVar8);
            goto LAB_005bc52d;
          }
        }
        else if (iWordStart < iWordStop) {
          lVar8 = (long)iWordStart;
          uVar10 = 0;
          do {
            uVar7 = ~*(uint *)(lVar5 + lVar8 * 4) | *(uint *)(lVar6 + lVar8 * 4);
            puVar4[lVar8] = uVar7;
            uVar10 = uVar10 ^ uVar7 * s_FraigPrimes[lVar8];
            lVar8 = lVar8 + 1;
          } while (iWordStop != lVar8);
          goto LAB_005bc52d;
        }
      }
      else if ((uVar1 & 1) == 0) {
        if (iWordStart < iWordStop) {
          lVar8 = (long)iWordStart;
          uVar10 = 0;
          do {
            uVar7 = *(uint *)(lVar6 + lVar8 * 4) & *(uint *)(lVar5 + lVar8 * 4);
            puVar4[lVar8] = uVar7;
            uVar10 = uVar10 ^ uVar7 * s_FraigPrimes[lVar8];
            lVar8 = lVar8 + 1;
          } while (iWordStop != lVar8);
          goto LAB_005bc52d;
        }
      }
      else if (iWordStart < iWordStop) {
        lVar8 = (long)iWordStart;
        uVar10 = 0;
        do {
          uVar7 = ~(*(uint *)(lVar6 + lVar8 * 4) & *(uint *)(lVar5 + lVar8 * 4));
          puVar4[lVar8] = uVar7;
          uVar10 = uVar10 ^ uVar7 * s_FraigPrimes[lVar8];
          lVar8 = lVar8 + 1;
        } while (iWordStop != lVar8);
        goto LAB_005bc52d;
      }
    }
    else if ((uVar1 & 1) == 0) {
      if (iWordStart < iWordStop) {
        lVar8 = (long)iWordStart;
        uVar10 = 0;
        do {
          uVar7 = ~*(uint *)(lVar5 + lVar8 * 4) & *(uint *)(lVar6 + lVar8 * 4);
          puVar4[lVar8] = uVar7;
          uVar10 = uVar10 ^ uVar7 * s_FraigPrimes[lVar8];
          lVar8 = lVar8 + 1;
        } while (iWordStop != lVar8);
        goto LAB_005bc52d;
      }
    }
    else if (iWordStart < iWordStop) {
      lVar8 = (long)iWordStart;
      uVar10 = 0;
      do {
        uVar7 = ~*(uint *)(lVar6 + lVar8 * 4) | *(uint *)(lVar5 + lVar8 * 4);
        puVar4[lVar8] = uVar7;
        uVar10 = uVar10 ^ uVar7 * s_FraigPrimes[lVar8];
        lVar8 = lVar8 + 1;
      } while (iWordStop != lVar8);
      goto LAB_005bc52d;
    }
  }
  else if ((uVar1 & 1) == 0) {
    if (iWordStart < iWordStop) {
      lVar8 = (long)iWordStart;
      uVar10 = 0;
      do {
        uVar7 = ~(*(uint *)(lVar6 + lVar8 * 4) | *(uint *)(lVar5 + lVar8 * 4));
        puVar4[lVar8] = uVar7;
        uVar10 = uVar10 ^ uVar7 * s_FraigPrimes[lVar8];
        lVar8 = lVar8 + 1;
      } while (iWordStop != lVar8);
      goto LAB_005bc52d;
    }
  }
  else if (iWordStart < iWordStop) {
    lVar8 = (long)iWordStart;
    uVar10 = 0;
    do {
      uVar7 = *(uint *)(lVar6 + lVar8 * 4) | *(uint *)(lVar5 + lVar8 * 4);
      puVar4[lVar8] = uVar7;
      uVar10 = uVar10 ^ uVar7 * s_FraigPrimes[lVar8];
      lVar8 = lVar8 + 1;
    } while (iWordStop != lVar8);
    goto LAB_005bc52d;
  }
  uVar10 = 0;
LAB_005bc52d:
  if (fUseRand == 0) {
    pNode->uHashD = pNode->uHashD ^ uVar10;
  }
  else {
    pNode->uHashR = pNode->uHashR ^ uVar10;
  }
  return;
}

Assistant:

void Fraig_NodeSimulate( Fraig_Node_t * pNode, int iWordStart, int iWordStop, int fUseRand )
{
    unsigned * pSims, * pSims1, * pSims2;
    unsigned uHash;
    int fCompl, fCompl1, fCompl2, i;

    assert( !Fraig_IsComplement(pNode) );

    // get hold of the simulation information
    pSims  = fUseRand? pNode->puSimR                    : pNode->puSimD;
    pSims1 = fUseRand? Fraig_Regular(pNode->p1)->puSimR : Fraig_Regular(pNode->p1)->puSimD;
    pSims2 = fUseRand? Fraig_Regular(pNode->p2)->puSimR : Fraig_Regular(pNode->p2)->puSimD;

    // get complemented attributes of the children using their random info
    fCompl  = pNode->fInv;
    fCompl1 = Fraig_NodeIsSimComplement(pNode->p1);
    fCompl2 = Fraig_NodeIsSimComplement(pNode->p2);

    // simulate
    uHash = 0;
    if ( fCompl1 && fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] | pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = ~(pSims1[i] | pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }
    else if ( fCompl1 && !fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] | ~pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (~pSims1[i] & pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }
    else if ( !fCompl1 && fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (~pSims1[i] | pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] & ~pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }
    else // if ( !fCompl1 && !fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = ~(pSims1[i] & pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] & pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }

    if ( fUseRand )
        pNode->uHashR ^= uHash;
    else
        pNode->uHashD ^= uHash;
}